

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O0

void __thiscall
so_5::stats::impl::std_controller_t::std_controller_t(std_controller_t *this,mbox_t *mbox)

{
  duration dVar1;
  mbox_t *mbox_local;
  std_controller_t *this_local;
  
  controller_t::controller_t(&this->super_controller_t);
  repository_t::repository_t(&this->super_repository_t);
  (this->super_controller_t)._vptr_controller_t = (_func_int **)&PTR_mbox_005c3578;
  (this->super_repository_t)._vptr_repository_t = (_func_int **)&DAT_005c35b8;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t(&this->m_mbox,mbox);
  std::mutex::mutex(&this->m_start_stop_lock);
  std::mutex::mutex(&this->m_data_lock);
  std::condition_variable::condition_variable(&this->m_wake_up_cond);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)
             &this->m_distribution_thread);
  this->m_shutdown_initiated = false;
  this->m_head = (source_t *)0x0;
  this->m_tail = (source_t *)0x0;
  dVar1 = controller_t::default_distribution_period();
  (this->m_distribution_period).__r = dVar1.__r;
  return;
}

Assistant:

std_controller_t::std_controller_t(
	mbox_t mbox )
	:	m_mbox( std::move( mbox ) )
	{}